

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vault.c
# Opt level: O0

char vault_occupied(char *array)

{
  char *local_20;
  char *ptr;
  char *array_local;
  
  local_20 = array;
  while( true ) {
    if (*local_20 == '\0') {
      return '\0';
    }
    if (level->rooms[*local_20 + -3].rtype == '\x04') break;
    local_20 = local_20 + 1;
  }
  return *local_20;
}

Assistant:

char vault_occupied(char *array)
{
	char *ptr;

	for (ptr = array; *ptr; ptr++)
		if (level->rooms[*ptr - ROOMOFFSET].rtype == VAULT)
			return *ptr;
	return '\0';
}